

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Renderbuffers::GetParameterErrorsTest::iterate
          (GetParameterErrorsTest *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  undefined1 local_40 [8];
  GLint return_value_dummy_storage;
  byte local_2f;
  byte local_2e;
  undefined1 local_2d;
  deUint32 local_2c;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  GetParameterErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  local_2c = (deUint32)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)local_2c);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    local_2e = 1;
    local_2f = 0;
    PrepareObjects(this);
    (**(code **)(lStack_20 + 0x950))(this->m_rbo_invalid,0x8d42,local_40);
    bVar1 = ExpectError(this,0x502,"GetNamedRenderbufferParameteriv",
                        "renderbuffer is not the name of an existing renderbuffer object.");
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0x950))(this->m_rbo_valid,this->m_parameter_invalid,local_40);
    bVar1 = ExpectError(this,0x500,"GetNamedRenderbufferParameteriv",
                        "parameter name is not one of the accepted parameter names described in specification."
                       );
    local_2e = (local_2e & 1 & bVar1) != 0;
    Clean(this);
    if ((local_2e & 1) == 0) {
      if ((local_2f & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetParameterErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Prepare objects. */
		PrepareObjects();

		glw::GLint return_value_dummy_storage;

		/*  Check that INVALID_OPERATION is generated by
		 GetNamedRenderbufferParameteriv if renderbuffer is not the name of an
		 existing renderbuffer object. */
		gl.getNamedRenderbufferParameteriv(m_rbo_invalid, GL_RENDERBUFFER_WIDTH, &return_value_dummy_storage);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "GetNamedRenderbufferParameteriv",
							 "renderbuffer is not the name of an existing renderbuffer object.");

		/*  Check that INVALID_ENUM is generated by GetNamedRenderbufferParameteriv
		 if parameter name is not one of the accepted parameter names described
		 in specification. */
		gl.getNamedRenderbufferParameteriv(m_rbo_valid, m_parameter_invalid, &return_value_dummy_storage);

		is_ok &= ExpectError(GL_INVALID_ENUM, "GetNamedRenderbufferParameteriv",
							 "parameter name is not one of the accepted parameter names described in specification.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}